

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_clone(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQObjectPtr *self;
  SQObjectPtr *target;
  SQRESULT SVar2;
  
  self = stack_get(v,idx);
  SQVM::PushNull(v);
  SVar2 = -1;
  target = SQVM::GetUp(v,-1);
  bVar1 = SQVM::Clone(v,self,target);
  if (bVar1) {
    SVar2 = 0;
  }
  else {
    SQVM::Pop(v);
  }
  return SVar2;
}

Assistant:

SQRESULT sq_clone(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v,idx);
    v->PushNull();
    if(!v->Clone(o, stack_get(v, -1))){
        v->Pop();
        return SQ_ERROR;
    }
    return SQ_OK;
}